

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int nn_sws_recv_hdr(nn_sws *self)

{
  void **ppvVar1;
  void *pvVar2;
  uint8_t *buf;
  byte *pbVar3;
  byte bVar4;
  void *pvVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar7;
  int extraout_EAX_02;
  size_t __n;
  ulong uVar8;
  ulong uVar9;
  nn_sws *__s;
  char *reason;
  ulong in_RSI;
  nn_fsm *self_00;
  nn_sws *self_01;
  nn_sws *pnVar10;
  nn_sws *buffer;
  ulong uVar11;
  uint16_t uStack_58;
  undefined4 uStack_54;
  nn_sws *pnStack_50;
  nn_iovec nStack_48;
  nn_sws *pnStack_38;
  
  if (self->continuing != 0) {
LAB_0012fd80:
    self->inmsg_control[0x6d] = '\0';
    self->inmsg_control[0x6e] = '\0';
    self->inmsg_control[0x6f] = '\0';
    self->inmsg_control[0x70] = '\0';
    self->inmsg_control[0x71] = '\0';
    self->inmsg_control[0x72] = '\0';
    self->inmsg_control[0x73] = '\0';
    self->inmsg_control[0x74] = '\0';
    self->inmsg_control[0x75] = '\0';
    self->inmsg_control[0x76] = '\0';
    self->inmsg_control[0x77] = '\0';
    self->inmsg_control[0x78] = '\0';
    self->inmsg_control[0x79] = '\0';
    self->inmsg_control[0x7a] = '\0';
    self->inmsg_control[0x7b] = '\0';
    self->inmsg_control[0x7c] = '\0';
    self->inmsg_control[0x60] = '\0';
    self->inmsg_control[0x61] = '\0';
    self->inmsg_control[0x62] = '\0';
    self->inmsg_control[99] = '\0';
    self->inmsg_control[100] = '\0';
    self->inmsg_control[0x65] = '\0';
    self->inmsg_control[0x66] = '\0';
    self->inmsg_control[0x67] = '\0';
    self->inmsg_control[0x68] = '\0';
    self->inmsg_control[0x69] = '\0';
    self->inmsg_control[0x6a] = '\0';
    self->inmsg_control[0x6b] = '\0';
    self->inmsg_control[0x6c] = '\0';
    self->inmsg_control[0x6d] = '\0';
    self->inmsg_control[0x6e] = '\0';
    self->inmsg_control[0x6f] = '\0';
    self->inmsg_control[0x50] = '\0';
    self->inmsg_control[0x51] = '\0';
    self->inmsg_control[0x52] = '\0';
    self->inmsg_control[0x53] = '\0';
    self->inmsg_control[0x54] = '\0';
    self->inmsg_control[0x55] = '\0';
    self->inmsg_control[0x56] = '\0';
    self->inmsg_control[0x57] = '\0';
    self->inmsg_control[0x58] = '\0';
    self->inmsg_control[0x59] = '\0';
    self->inmsg_control[0x5a] = '\0';
    self->inmsg_control[0x5b] = '\0';
    self->inmsg_control[0x5c] = '\0';
    self->inmsg_control[0x5d] = '\0';
    self->inmsg_control[0x5e] = '\0';
    self->inmsg_control[0x5f] = '\0';
    self->inmsg_control[0x40] = '\0';
    self->inmsg_control[0x41] = '\0';
    self->inmsg_control[0x42] = '\0';
    self->inmsg_control[0x43] = '\0';
    self->inmsg_control[0x44] = '\0';
    self->inmsg_control[0x45] = '\0';
    self->inmsg_control[0x46] = '\0';
    self->inmsg_control[0x47] = '\0';
    self->inmsg_control[0x48] = '\0';
    self->inmsg_control[0x49] = '\0';
    self->inmsg_control[0x4a] = '\0';
    self->inmsg_control[0x4b] = '\0';
    self->inmsg_control[0x4c] = '\0';
    self->inmsg_control[0x4d] = '\0';
    self->inmsg_control[0x4e] = '\0';
    self->inmsg_control[0x4f] = '\0';
    self->inmsg_control[0x30] = '\0';
    self->inmsg_control[0x31] = '\0';
    self->inmsg_control[0x32] = '\0';
    self->inmsg_control[0x33] = '\0';
    self->inmsg_control[0x34] = '\0';
    self->inmsg_control[0x35] = '\0';
    self->inmsg_control[0x36] = '\0';
    self->inmsg_control[0x37] = '\0';
    self->inmsg_control[0x38] = '\0';
    self->inmsg_control[0x39] = '\0';
    self->inmsg_control[0x3a] = '\0';
    self->inmsg_control[0x3b] = '\0';
    self->inmsg_control[0x3c] = '\0';
    self->inmsg_control[0x3d] = '\0';
    self->inmsg_control[0x3e] = '\0';
    self->inmsg_control[0x3f] = '\0';
    self->inmsg_control[0x20] = '\0';
    self->inmsg_control[0x21] = '\0';
    self->inmsg_control[0x22] = '\0';
    self->inmsg_control[0x23] = '\0';
    self->inmsg_control[0x24] = '\0';
    self->inmsg_control[0x25] = '\0';
    self->inmsg_control[0x26] = '\0';
    self->inmsg_control[0x27] = '\0';
    self->inmsg_control[0x28] = '\0';
    self->inmsg_control[0x29] = '\0';
    self->inmsg_control[0x2a] = '\0';
    self->inmsg_control[0x2b] = '\0';
    self->inmsg_control[0x2c] = '\0';
    self->inmsg_control[0x2d] = '\0';
    self->inmsg_control[0x2e] = '\0';
    self->inmsg_control[0x2f] = '\0';
    self->inmsg_control[0x10] = '\0';
    self->inmsg_control[0x11] = '\0';
    self->inmsg_control[0x12] = '\0';
    self->inmsg_control[0x13] = '\0';
    self->inmsg_control[0x14] = '\0';
    self->inmsg_control[0x15] = '\0';
    self->inmsg_control[0x16] = '\0';
    self->inmsg_control[0x17] = '\0';
    self->inmsg_control[0x18] = '\0';
    self->inmsg_control[0x19] = '\0';
    self->inmsg_control[0x1a] = '\0';
    self->inmsg_control[0x1b] = '\0';
    self->inmsg_control[0x1c] = '\0';
    self->inmsg_control[0x1d] = '\0';
    self->inmsg_control[0x1e] = '\0';
    self->inmsg_control[0x1f] = '\0';
    self->inmsg_control[0] = '\0';
    self->inmsg_control[1] = '\0';
    self->inmsg_control[2] = '\0';
    self->inmsg_control[3] = '\0';
    self->inmsg_control[4] = '\0';
    self->inmsg_control[5] = '\0';
    self->inmsg_control[6] = '\0';
    self->inmsg_control[7] = '\0';
    self->inmsg_control[8] = '\0';
    self->inmsg_control[9] = '\0';
    self->inmsg_control[10] = '\0';
    self->inmsg_control[0xb] = '\0';
    self->inmsg_control[0xc] = '\0';
    self->inmsg_control[0xd] = '\0';
    self->inmsg_control[0xe] = '\0';
    self->inmsg_control[0xf] = '\0';
    self->inhdr[0] = '\0';
    self->inhdr[1] = '\0';
    self->inhdr[2] = '\0';
    self->inhdr[3] = '\0';
    self->inhdr[4] = '\0';
    self->inhdr[5] = '\0';
    self->inhdr[6] = '\0';
    self->inhdr[7] = '\0';
    self->inhdr[6] = '\0';
    self->inhdr[7] = '\0';
    self->inhdr[8] = '\0';
    self->inhdr[9] = '\0';
    self->inhdr[10] = '\0';
    self->inhdr[0xb] = '\0';
    self->inhdr[0xc] = '\0';
    self->inhdr[0xd] = '\0';
    self->instate = 1;
    nn_usock_recv(self->usock,self->inhdr,2,(int *)0x0);
    return extraout_EAX;
  }
  self_00 = (nn_fsm *)&self->inmsg_array;
  iVar6 = nn_list_empty((nn_list *)self_00);
  if (iVar6 != 0) {
    *(undefined8 *)((long)&self->inmsg_current_chunk_len + 4) = 0;
    *(undefined8 *)((long)&self->inmsg_total_size + 4) = 0;
    self->inmsg_current_chunk_buf = (uint8_t *)0x0;
    self->inmsg_current_chunk_len = 0;
    goto LAB_0012fd80;
  }
  nn_sws_recv_hdr_cold_1();
  self_01 = (nn_sws *)(ulong)*(uint *)&self_00[1].fn;
  pnStack_38 = self;
  if (*(uint *)&self_00[1].fn == 4) {
    uVar8 = in_RSI;
    nn_msg_array_term((nn_list *)&self_00[0x41].owner);
    self_01 = __s;
    __n = strlen((char *)__s);
    uVar11 = __n + 2;
    if (uVar11 < 0x7e) {
      *(undefined1 *)((long)&self_00[0x43].srcptr + 2) = 0x88;
      *(byte *)((long)&self_00[0x43].srcptr + 3) = (byte)uVar11;
      self_00[0x44].stopped.srcptr = (void *)0x2;
      pnStack_50 = __s;
      if (self_00[1].src == 2) {
LAB_0012fe9b:
        pvVar2 = (void *)((long)&self_00[0x43].srcptr + 2);
        pvVar5 = self_00[0x44].stopped.srcptr;
        buf = (uint8_t *)((long)pvVar5 + (long)pvVar2);
        uStack_58 = (uint16_t)in_RSI;
        nn_puts(buf,uStack_58);
        ppvVar1 = &self_00[0x44].stopped.srcptr;
        *ppvVar1 = (void *)((long)*ppvVar1 + 2);
        memcpy((undefined1 *)((long)pvVar5 + (long)pvVar2) + 2,pnStack_50,__n);
        if ((uVar11 != 0) && (self_00[1].src == 1)) {
          uVar8 = 0;
          do {
            pbVar3 = buf + uVar8;
            *pbVar3 = *pbVar3 ^ *(byte *)((long)&uStack_54 + (ulong)((uint)uVar8 & 3));
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) < uVar11);
        }
        ppvVar1 = &self_00[0x44].stopped.srcptr;
        *ppvVar1 = (void *)((long)*ppvVar1 + uVar11);
        *(undefined4 *)&self_00[0x40].ctx = 7;
        nn_pipebase_stop((nn_pipebase *)&self_00[0x3d].stopped.type);
        if (self_00[0x44].stopped.type == 1) {
          nStack_48.iov_len = (size_t)self_00[0x44].stopped.srcptr;
          nStack_48.iov_base = pvVar2;
          nn_usock_send((nn_usock *)self_00[1].srcptr,&nStack_48,1);
          self_00[0x44].stopped.type = 2;
          *(undefined4 *)&self_00[1].fn = 5;
          iVar6 = extraout_EAX_00;
        }
        else {
          *(undefined4 *)&self_00[1].fn = 7;
          nn_fsm_raise(self_00,(nn_fsm_event *)&self_00[0x46].state,2);
          iVar6 = extraout_EAX_01;
        }
        return iVar6;
      }
      if (self_00[1].src == 1) {
        *(byte *)((long)&self_00[0x43].srcptr + 3) = (byte)uVar11 | 0x80;
        nn_random_generate(&uStack_54,4);
        *(undefined4 *)((long)&self_00[0x43].srcptr + 4) = uStack_54;
        ppvVar1 = &self_00[0x44].stopped.srcptr;
        *ppvVar1 = (void *)((long)*ppvVar1 + 4);
        goto LAB_0012fe9b;
      }
      goto LAB_0012ff89;
    }
  }
  else {
    nn_sws_fail_conn_cold_1();
    uVar8 = in_RSI;
  }
  nn_sws_fail_conn_cold_3();
LAB_0012ff89:
  nn_sws_fail_conn_cold_2();
  uVar11 = self_01->inmsg_current_chunk_len;
  buffer = (nn_sws *)self_01->inmsg_current_chunk_buf;
  pnVar10 = self_01;
  if (self_01->utf8_code_pt_fragment_len == 0) {
LAB_00130023:
    if (self_01->utf8_code_pt_fragment_len < 4) {
      do {
        if (uVar11 == 0) {
          self_01->utf8_code_pt_fragment_len = 0;
          self_01->utf8_code_pt_fragment[0] = '\0';
          self_01->utf8_code_pt_fragment[1] = '\0';
          self_01->utf8_code_pt_fragment[2] = '\0';
          self_01->utf8_code_pt_fragment[3] = '\0';
          if (self_01->is_final_frame != 0) {
            self_01->instate = 4;
            nn_pipebase_received(&self_01->pipebase);
            return extraout_EAX_02;
          }
LAB_001300d7:
          iVar6 = nn_sws_recv_hdr(self_01);
          return iVar6;
        }
        uVar8 = uVar11;
        pnVar10 = buffer;
        uVar7 = nn_utf8_code_point((uint8_t *)buffer,uVar11);
        if ((int)uVar7 < 1) {
          if (uVar7 == 0xfffffffe) {
            self_01->utf8_code_pt_fragment_len = 0;
            self_01->utf8_code_pt_fragment[0] = '\0';
            self_01->utf8_code_pt_fragment[1] = '\0';
            self_01->utf8_code_pt_fragment[2] = '\0';
            self_01->utf8_code_pt_fragment[3] = '\0';
            reason = "Invalid UTF-8 code point in payload.";
            goto LAB_00130106;
          }
          if (uVar7 != 0xffffffff) {
            do {
            } while( true );
          }
          if (uVar11 < 4) {
            self_01->utf8_code_pt_fragment_len = uVar11;
            memcpy(self_01->utf8_code_pt_fragment,buffer,uVar11);
LAB_001300c3:
            if (self_01->is_final_frame == 0) goto LAB_001300d7;
            reason = "Truncated UTF-8 payload with invalid code point.";
            goto LAB_00130106;
          }
          goto LAB_00130128;
        }
        uVar9 = (ulong)uVar7;
        if (uVar11 < uVar9) {
          nn_sws_validate_utf8_chunk_cold_3();
          goto LAB_00130123;
        }
        buffer = (nn_sws *)((long)&(buffer->fsm).fn + uVar9);
        uVar11 = uVar11 - uVar9;
      } while( true );
    }
  }
  else {
    if (self_01->utf8_code_pt_fragment_len < 4) {
      do {
        uVar11 = uVar11 - 1;
        if (uVar11 == 0xffffffffffffffff) {
          uVar11 = 0;
          goto LAB_00130023;
        }
        self_01->utf8_code_pt_fragment[self_01->utf8_code_pt_fragment_len] =
             *(uint8_t *)&(buffer->fsm).fn;
        uVar8 = self_01->utf8_code_pt_fragment_len + 1;
        self_01->utf8_code_pt_fragment_len = uVar8;
        pnVar10 = (nn_sws *)self_01->utf8_code_pt_fragment;
        iVar6 = nn_utf8_code_point(self_01->utf8_code_pt_fragment,uVar8);
        if (0 < iVar6) {
          buffer = (nn_sws *)((long)&(buffer->fsm).fn + 1);
          goto LAB_00130023;
        }
        if (iVar6 == -1) goto LAB_001300c3;
        buffer = (nn_sws *)((long)&(buffer->fsm).fn + 1);
      } while (iVar6 != -2);
      reason = "Invalid UTF-8 code point split on previous frame.";
LAB_00130106:
      iVar6 = nn_sws_fail_conn(self_01,0x3ef,reason);
      return iVar6;
    }
LAB_00130123:
    nn_sws_validate_utf8_chunk_cold_1();
LAB_00130128:
    nn_sws_validate_utf8_chunk_cold_2();
  }
  nn_sws_validate_utf8_chunk_cold_4();
  if (uVar8 == 0 || pnVar10 == (nn_sws *)0x0) {
    return -1;
  }
  bVar4 = *(byte *)&(pnVar10->fsm).fn;
  iVar6 = 1;
  if (((char)bVar4 < '\0') && (iVar6 = -2, 0xc1 < bVar4)) {
    if (bVar4 < 0xe0) {
      iVar6 = -1;
      if (1 < uVar8) {
        return -2;
      }
    }
    else if (bVar4 < 0xf0) {
      if (uVar8 < 2) {
        return -1;
      }
      if (bVar4 == 0xed) {
        if (0x9f < *(byte *)((long)&(pnVar10->fsm).fn + 1)) {
          return -2;
        }
      }
      else if ((bVar4 == 0xe0) && (*(byte *)((long)&(pnVar10->fsm).fn + 1) < 0xa0)) {
        return -2;
      }
      iVar6 = -1;
      if (uVar8 != 2) {
        iVar6 = -2;
      }
    }
    else if (bVar4 < 0xf5) {
      if (uVar8 < 2) {
        return -1;
      }
      if (bVar4 == 0xf4) {
        if (0x8f < *(byte *)((long)&(pnVar10->fsm).fn + 1)) {
          return -2;
        }
      }
      else if ((bVar4 == 0xf0) && (*(byte *)((long)&(pnVar10->fsm).fn + 1) < 0x90)) {
        return -2;
      }
      iVar6 = -1;
      if (3 < uVar8) {
        return -2;
      }
    }
  }
  return iVar6;
}

Assistant:

static int nn_sws_recv_hdr (struct nn_sws *self)
{
    if (!self->continuing) {
        nn_assert (nn_list_empty (&self->inmsg_array));

        self->inmsg_current_chunk_buf = NULL;
        self->inmsg_chunks = 0;
        self->inmsg_current_chunk_len = 0;
        self->inmsg_total_size = 0;
    }

    memset (self->inmsg_control, 0, NN_SWS_PAYLOAD_MAX_LENGTH);
    memset (self->inhdr, 0, NN_SWS_FRAME_MAX_HDR_LEN);
    self->instate = NN_SWS_INSTATE_RECV_HDR;
    nn_usock_recv (self->usock, self->inhdr, NN_SWS_FRAME_SIZE_INITIAL, NULL);

    return 0;
}